

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void andres::marray_detail::
     operate<andres::marray_detail::TimesEqual<float,float>,float,std::allocator<unsigned_long>>
               (View<float,_false,_std::allocator<unsigned_long>_> *v,float *x)

{
  bool bVar1;
  reference pfVar2;
  size_t sVar3;
  reference pfVar4;
  size_t j;
  size_t sVar5;
  iterator it;
  iterator iStack_48;
  
  bVar1 = View<float,_false,_std::allocator<unsigned_long>_>::isSimple(v);
  if (bVar1) {
    pfVar2 = View<float,false,std::allocator<unsigned_long>>::operator()
                       ((View<float,false,std::allocator<unsigned_long>> *)v,0);
    sVar3 = (v->geometry_).size_;
    for (sVar5 = 0; sVar3 != sVar5; sVar5 = sVar5 + 1) {
      pfVar2[sVar5] = *x * pfVar2[sVar5];
    }
  }
  else {
    sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 1) {
      pfVar2 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)1,_andres::marray_detail::TimesEqual<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
      ::operate(v,x,pfVar2);
      return;
    }
    sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 2) {
      pfVar2 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)2,_andres::marray_detail::TimesEqual<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
      ::operate(v,x,pfVar2);
      return;
    }
    sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 3) {
      pfVar2 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)3,_andres::marray_detail::TimesEqual<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
      ::operate(v,x,pfVar2);
      return;
    }
    sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 4) {
      pfVar2 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)4,_andres::marray_detail::TimesEqual<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
      ::operate(v,x,pfVar2);
      return;
    }
    sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 5) {
      pfVar2 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)5,_andres::marray_detail::TimesEqual<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
      ::operate(v,x,pfVar2);
      return;
    }
    sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 6) {
      pfVar2 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)6,_andres::marray_detail::TimesEqual<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
      ::operate(v,x,pfVar2);
      return;
    }
    sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 7) {
      pfVar2 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)7,_andres::marray_detail::TimesEqual<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
      ::operate(v,x,pfVar2);
      return;
    }
    sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 8) {
      pfVar2 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)8,_andres::marray_detail::TimesEqual<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
      ::operate(v,x,pfVar2);
      return;
    }
    sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 9) {
      pfVar2 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)9,_andres::marray_detail::TimesEqual<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
      ::operate(v,x,pfVar2);
      return;
    }
    sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 10) {
      pfVar2 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)10,_andres::marray_detail::TimesEqual<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
      ::operate(v,x,pfVar2);
      return;
    }
    View<float,_false,_std::allocator<unsigned_long>_>::begin(&iStack_48,v);
    while( true ) {
      bVar1 = Iterator<float,_false,_std::allocator<unsigned_long>_>::hasMore(&iStack_48);
      if (!bVar1) break;
      pfVar4 = Iterator<float,_false,_std::allocator<unsigned_long>_>::operator*(&iStack_48);
      *pfVar4 = *x * *pfVar4;
      Iterator<float,_false,_std::allocator<unsigned_long>_>::operator++(&iStack_48);
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&iStack_48.coordinates_.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
  return;
}

Assistant:

inline void 
operate
(
    View<T, false, A>& v, 
    const T& x, 
    Functor f
)
{
    if(v.isSimple()) {
        T* data = &v(0);
        for(std::size_t j=0; j<v.size(); ++j) {
            f(data[j], x);
        }
    }
    else if(v.dimension() == 1)
        OperateHelperBinaryScalar<1, Functor, T, T, A>::operate(v, x, f, &v(0));
    else if(v.dimension() == 2)
        OperateHelperBinaryScalar<2, Functor, T, T, A>::operate(v, x, f, &v(0));
    else if(v.dimension() == 3)
        OperateHelperBinaryScalar<3, Functor, T, T, A>::operate(v, x, f, &v(0));
    else if(v.dimension() == 4)
        OperateHelperBinaryScalar<4, Functor, T, T, A>::operate(v, x, f, &v(0));
    else if(v.dimension() == 5)
        OperateHelperBinaryScalar<5, Functor, T, T, A>::operate(v, x, f, &v(0));
    else if(v.dimension() == 6)
        OperateHelperBinaryScalar<6, Functor, T, T, A>::operate(v, x, f, &v(0));
    else if(v.dimension() == 7)
        OperateHelperBinaryScalar<7, Functor, T, T, A>::operate(v, x, f, &v(0));
    else if(v.dimension() == 8)
        OperateHelperBinaryScalar<8, Functor, T, T, A>::operate(v, x, f, &v(0));
    else if(v.dimension() == 9)
        OperateHelperBinaryScalar<9, Functor, T, T, A>::operate(v, x, f, &v(0));
    else if(v.dimension() == 10)
        OperateHelperBinaryScalar<10, Functor, T, T, A>::operate(v, x, f, &v(0));
    else {
        for(typename View<T, false, A>::iterator it = v.begin(); it.hasMore(); ++it) {
            f(*it, x); 
        }
    }
}